

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakCallback.h
# Opt level: O0

void __thiscall
sznet::WeakCallback<sznet::net::KcpConnection>::WeakCallback
          (WeakCallback<sznet::net::KcpConnection> *this,weak_ptr<sznet::net::KcpConnection> *object
          ,function<void_(sznet::net::KcpConnection_*)> *function)

{
  function<void_(sznet::net::KcpConnection_*)> *function_local;
  weak_ptr<sznet::net::KcpConnection> *object_local;
  WeakCallback<sznet::net::KcpConnection> *this_local;
  
  std::weak_ptr<sznet::net::KcpConnection>::weak_ptr(&this->m_object,object);
  std::function<void_(sznet::net::KcpConnection_*)>::function(&this->m_function,function);
  return;
}

Assistant:

WeakCallback(const std::weak_ptr<CLASS>& object, const std::function<void(CLASS*, ARGS...)>& function): 
		m_object(object),
		m_function(function)
	{
	}